

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O0

int cfg_validate_strlen(autobuf *out,char *section_name,char *entry_name,char *value,size_t len)

{
  size_t sVar1;
  size_t len_local;
  char *value_local;
  char *entry_name_local;
  char *section_name_local;
  autobuf *out_local;
  
  sVar1 = strlen(value);
  if (len < sVar1) {
    cfg_append_printable_line
              (out,"Value \'%s\' for entry \'%s\' in section %s is longer than %zu characters",value
               ,entry_name,section_name,len);
    out_local._4_4_ = -1;
  }
  else {
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

int
cfg_validate_strlen(
  struct autobuf *out, const char *section_name, const char *entry_name, const char *value, size_t len) {
  if (strlen(value) > len) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s is longer than %" PRINTF_SIZE_T_SPECIFIER " characters",
      value, entry_name, section_name, len);
    return -1;
  }
  return 0;
}